

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall
tinyusdz::Attribute::get_value<std::vector<bool,std::allocator<bool>>>
          (Attribute *this,vector<bool,_std::allocator<bool>_> *v)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 unaff_EBP;
  undefined8 unaff_R12;
  undefined4 unaff_R13D;
  undefined8 unaff_R14;
  undefined4 local_70;
  uint local_6c;
  optional<std::vector<bool,_std::allocator<bool>_>_> local_68;
  _Bit_type *local_38;
  
  if (v == (vector<bool,_std::allocator<bool>_> *)0x0) {
    local_68.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<std::vector<bool,std::allocator<bool>>>(&local_68,&this->_var);
    uVar3 = local_68.contained._32_8_;
    uVar2 = local_68.contained._8_4_;
    uVar1 = local_68.contained.data._0_8_;
    if (local_68.has_value_ == true) {
      local_70 = local_68.contained._12_4_;
      local_38 = (_Bit_type *)local_68.contained._16_8_;
      local_6c = local_68.contained._24_4_;
      local_68.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_68.contained._8_4_ = 0;
      local_68.contained._16_8_ = (_Bit_type *)0x0;
      local_68.contained._24_4_ = 0;
      local_68.contained._32_8_ = (_Bit_pointer)0x0;
      unaff_R12 = uVar3;
      unaff_R14 = uVar1;
      unaff_R13D = uVar2;
      unaff_EBP = local_68.contained._28_4_;
    }
    if (local_68.has_value_ != false) {
      if (local_68.contained.data.__align != (anon_struct_8_0_00000001_for___align)0x0) {
        operator_delete((void *)local_68.contained.data._0_8_,
                        local_68.contained._32_8_ - local_68.contained._0_8_);
        local_68.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_68.contained._8_4_ = 0;
        local_68.contained._16_8_ = (_Bit_type *)0x0;
        local_68.contained._24_4_ = 0;
        local_68.contained._32_8_ = (_Bit_pointer)0x0;
      }
      if (local_68.has_value_ != false) {
        std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
                  (&v->super__Bvector_base<std::allocator<bool>_>);
        (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p = (_Bit_type *)unaff_R14;
        (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_offset = unaff_R13D;
        *(undefined4 *)
         &(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
          super__Bit_iterator_base.field_0xc = local_70;
        (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
        super__Bit_iterator_base._M_p = local_38;
        (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
        super__Bit_iterator_base._M_offset = local_6c;
        *(undefined4 *)
         &(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish
          .super__Bit_iterator_base.field_0xc = unaff_EBP;
        (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)unaff_R12;
        unaff_R14 = (anon_struct_8_0_00000001_for___align)0x0;
        unaff_R12 = (_Bit_pointer)0x0;
      }
    }
    if (((anon_struct_8_0_00000001_for___align)unaff_R14 !=
         (anon_struct_8_0_00000001_for___align)0x0 & local_68.has_value_) == 1) {
      operator_delete((void *)unaff_R14,unaff_R12 - unaff_R14);
    }
  }
  return local_68.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }